

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_mut_sa(REF_DBL turb,REF_DBL rho,REF_DBL nu,REF_DBL *mut_sa)

{
  double dVar1;
  double dVar2;
  double local_68;
  double local_58;
  REF_DBL cv1;
  REF_DBL fv1;
  REF_DBL chi3;
  REF_DBL chi;
  REF_DBL *mut_sa_local;
  REF_DBL nu_local;
  REF_DBL rho_local;
  REF_DBL turb_local;
  
  if (((turb <= 0.0) || (rho <= 0.0)) || (nu <= 0.0)) {
    *mut_sa = 0.0;
  }
  else {
    if (nu * 1e+20 <= 0.0) {
      local_58 = -(nu * 1e+20);
    }
    else {
      local_58 = nu * 1e+20;
    }
    local_68 = turb;
    if (turb <= 0.0) {
      local_68 = -turb;
    }
    if (local_58 <= local_68) {
      return 4;
    }
    dVar1 = pow(turb / nu,3.0);
    dVar2 = pow(7.1,3.0);
    *mut_sa = rho * turb * (dVar1 / (dVar1 + dVar2));
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_mut_sa(REF_DBL turb, REF_DBL rho, REF_DBL nu,
                                   REF_DBL *mut_sa) {
  if (turb > 0.0 && rho > 0.0 && nu > 0.0) {
    REF_DBL chi, chi3, fv1;
    REF_DBL cv1 = 7.1;
    if (!ref_math_divisible(turb, nu)) return REF_DIV_ZERO;
    chi = turb / nu;
    chi3 = pow(chi, 3);
    fv1 = chi3 / (chi3 + pow(cv1, 3));
    *mut_sa = rho * turb * fv1;
  } else {
    *mut_sa = 0.0;
  }
  return REF_SUCCESS;
}